

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_str2flag(char *str)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *in_RAX;
  long lVar4;
  uint uVar5;
  size_t __n;
  uint uVar6;
  uint uVar7;
  char *end;
  char *local_38;
  
  local_38 = in_RAX;
  lVar4 = strtol(str,&local_38,0);
  if (local_38 == str) {
    cVar1 = *str;
    uVar6 = 0;
    if (cVar1 != '\0') {
      uVar7 = 0;
      do {
        __n = 0;
        while( true ) {
          local_38 = str + __n;
          cVar2 = str[__n];
          if ((cVar2 == '\0') || (cVar2 == ',')) break;
          __n = __n + 1;
        }
        iVar3 = strncasecmp("PAIRED",str,__n);
      } while (((((((__n == 6) && (uVar5 = 1, iVar3 == 0)) ||
                  ((iVar3 = strncasecmp("PROPER_PAIR",str,__n), __n == 0xb &&
                   (uVar5 = 2, iVar3 == 0)))) ||
                 (((iVar3 = strncasecmp("UNMAP",str,__n), __n == 5 && (uVar5 = 4, iVar3 == 0)) ||
                  ((((iVar3 = strncasecmp("MUNMAP",str,__n), __n == 6 && (uVar5 = 8, iVar3 == 0)) ||
                    ((iVar3 = strncasecmp("REVERSE",str,__n), __n == 7 && (uVar5 = 0x10, iVar3 == 0)
                     ))) || ((iVar3 = strncasecmp("MREVERSE",str,__n), __n == 8 &&
                             (uVar5 = 0x20, iVar3 == 0)))))))) ||
                ((iVar3 = strncasecmp("READ1",str,__n), __n == 5 && (uVar5 = 0x40, iVar3 == 0)))) ||
               (((((iVar3 = strncasecmp("READ2",str,__n), __n == 5 && (uVar5 = 0x80, iVar3 == 0)) ||
                  ((iVar3 = strncasecmp("SECONDARY",str,__n), __n == 9 &&
                   (uVar5 = 0x100, iVar3 == 0)))) ||
                 ((iVar3 = strncasecmp("QCFAIL",str,__n), __n == 6 && (uVar5 = 0x200, iVar3 == 0))))
                || (((iVar3 = strncasecmp("DUP",str,__n), __n == 3 && (uVar5 = 0x400, iVar3 == 0))
                    || ((iVar3 = strncasecmp("SUPPLEMENTARY",str,__n), uVar6 = 0xffffffff,
                        __n == 0xd && (uVar5 = 0x800, iVar3 == 0)))))))) &&
              ((uVar6 = uVar7 | uVar5, cVar2 != '\0' &&
               (str = str + __n + 1, uVar7 = uVar6, cVar1 != '\0'))));
    }
  }
  else {
    uVar6 = (uint)lVar4;
  }
  return uVar6;
}

Assistant:

int bam_str2flag(const char *str)
{
    char *end, *beg = (char*) str;
    long int flag = strtol(str, &end, 0);
    if ( end!=str ) return flag;    // the conversion was successful
    flag = 0;
    while ( *str )
    {
        end = beg;
        while ( *end && *end!=',' ) end++;
        if ( !STRNCMP("PAIRED",beg,end-beg) ) flag |= BAM_FPAIRED;
        else if ( !STRNCMP("PROPER_PAIR",beg,end-beg) ) flag |= BAM_FPROPER_PAIR;
        else if ( !STRNCMP("UNMAP",beg,end-beg) ) flag |= BAM_FUNMAP;
        else if ( !STRNCMP("MUNMAP",beg,end-beg) ) flag |= BAM_FMUNMAP;
        else if ( !STRNCMP("REVERSE",beg,end-beg) ) flag |= BAM_FREVERSE;
        else if ( !STRNCMP("MREVERSE",beg,end-beg) ) flag |= BAM_FMREVERSE;
        else if ( !STRNCMP("READ1",beg,end-beg) ) flag |= BAM_FREAD1;
        else if ( !STRNCMP("READ2",beg,end-beg) ) flag |= BAM_FREAD2;
        else if ( !STRNCMP("SECONDARY",beg,end-beg) ) flag |= BAM_FSECONDARY;
        else if ( !STRNCMP("QCFAIL",beg,end-beg) ) flag |= BAM_FQCFAIL;
        else if ( !STRNCMP("DUP",beg,end-beg) ) flag |= BAM_FDUP;
        else if ( !STRNCMP("SUPPLEMENTARY",beg,end-beg) ) flag |= BAM_FSUPPLEMENTARY;
        else return -1;
        if ( !*end ) break;
        beg = end + 1;
    }
    return flag;
}